

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

double __thiscall ON_SubDFace::MaximumEdgeSharpness(ON_SubDFace *this)

{
  bool bVar1;
  ON_SubDEdgePtr *pOVar2;
  double m;
  ON_SubDEdgeSharpness s;
  ON_SubDEdge *e;
  ON_SubDEdgePtr *pOStack_20;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  double max_edge_sharpness;
  ON_SubDFace *this_local;
  
  eptr = (ON_SubDEdgePtr *)0x0;
  pOStack_20 = this->m_edge4;
  e._6_2_ = 0;
  while ((e._6_2_ < this->m_edge_count &&
         ((e._6_2_ != 4 || (pOStack_20 = this->m_edgex, pOStack_20 != (ON_SubDEdgePtr *)0x0))))) {
    s.m_edge_sharpness = (float  [2])(pOStack_20->m_ptr & 0xfffffffffffffff8);
    if ((s.m_edge_sharpness != (float  [2])0x0) &&
       (bVar1 = ON_SubDEdge::IsSharp((ON_SubDEdge *)s.m_edge_sharpness), bVar1)) {
      m = (double)ON_SubDEdge::Sharpness((ON_SubDEdge *)s.m_edge_sharpness,false);
      pOVar2 = (ON_SubDEdgePtr *)
               ON_SubDEdgeSharpness::MaximumEndSharpness((ON_SubDEdgeSharpness *)&m);
      if ((double)eptr < (double)pOVar2) {
        eptr = pOVar2;
      }
    }
    e._6_2_ = e._6_2_ + 1;
    pOStack_20 = pOStack_20 + 1;
  }
  return (double)eptr;
}

Assistant:

double ON_SubDFace::MaximumEdgeSharpness() const
{
  double max_edge_sharpness = 0.0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr == e || false == e->IsSharp())
      continue;
    const ON_SubDEdgeSharpness s = e->Sharpness(false);
    const double m = s.MaximumEndSharpness();
    if (m > max_edge_sharpness)
      max_edge_sharpness = m;
  }
  return max_edge_sharpness;
}